

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_end(XmlReporter *this,CurrentTestCaseStats *st)

{
  XmlWriter *this_00;
  XmlWriter *this_01;
  int *in_RSI;
  long in_RDI;
  double *in_stack_00000050;
  string *in_stack_00000058;
  XmlWriter *in_stack_00000060;
  string *in_stack_fffffffffffffe88;
  XmlWriter *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string *in_stack_fffffffffffffe98;
  XmlWriter *in_stack_fffffffffffffea0;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_109;
  allocator<char> local_e1 [40];
  allocator<char> local_b9 [40];
  allocator<char> local_91 [33];
  int local_70;
  allocator<char> local_69 [56];
  allocator<char> local_31 [33];
  int *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  this_00 = XmlWriter::startElement(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  __s = local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,in_stack_fffffffffffffec0);
  local_70 = *local_10 - local_10[1];
  this_01 = XmlWriter::writeAttribute<int>
                      (in_stack_00000060,in_stack_00000058,(int *)in_stack_00000050);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,(allocator<char> *)this_01);
  XmlWriter::writeAttribute<int>(in_stack_00000060,in_stack_00000058,(int *)in_stack_00000050);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,(allocator<char> *)this_01);
  XmlWriter::writeAttribute
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  std::allocator<char>::~allocator(local_b9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  std::allocator<char>::~allocator(local_91);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  std::allocator<char>::~allocator(local_69);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  std::allocator<char>::~allocator(local_31);
  if ((*(byte *)(*(long *)(in_RDI + 0x78) + 0x6f) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,(allocator<char> *)this_01);
    XmlWriter::writeAttribute<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe90);
    std::allocator<char>::~allocator(local_e1);
  }
  if (*(int *)(*(long *)(in_RDI + 0x80) + 0x40) != 0) {
    this_02 = &local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,(allocator<char> *)this_01);
    XmlWriter::writeAttribute<int>(in_stack_00000060,in_stack_00000058,(int *)in_stack_00000050);
    std::__cxx11::string::~string(this_02);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  XmlWriter::endElement(this_01);
  XmlWriter::endElement(this_01);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            xml.startElement("OverallResultsAsserts")
                    .writeAttribute("successes",
                                    st.numAssertsCurrentTest - st.numAssertsFailedCurrentTest)
                    .writeAttribute("failures", st.numAssertsFailedCurrentTest)
                    .writeAttribute("test_case_success", st.testCaseSuccess);
            if(opt.duration)
                xml.writeAttribute("duration", st.seconds);
            if(tc->m_expected_failures)
                xml.writeAttribute("expected_failures", tc->m_expected_failures);
            xml.endElement();

            xml.endElement();
        }